

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon.cxx
# Opt level: O2

Fl_File_Icon * Fl_File_Icon::find(char *filename,int filetype)

{
  int iVar1;
  char *s;
  Fl_File_Icon **ppFVar2;
  stat fileinfo;
  
  if (filetype == 0) {
    iVar1 = fl_stat(filename,&fileinfo);
    if (iVar1 == 0) {
      filetype = 5;
      if ((fileinfo.st_mode & 0xf000) != 0x4000) {
        filetype = ((fileinfo.st_mode & 0xf000) == 0x1000) + 1;
      }
    }
    else {
      filetype = 1;
    }
  }
  s = fl_filename_name(filename);
  ppFVar2 = &first_;
  while( true ) {
    do {
      ppFVar2 = &((Fl_File_Icon *)ppFVar2)->next_->next_;
      if ((Fl_File_Icon *)ppFVar2 == (Fl_File_Icon *)0x0) {
        return (Fl_File_Icon *)0x0;
      }
    } while (((Fl_File_Icon *)ppFVar2)->type_ != filetype && ((Fl_File_Icon *)ppFVar2)->type_ != 0);
    iVar1 = fl_filename_match(filename,((Fl_File_Icon *)ppFVar2)->pattern_);
    if (iVar1 != 0) break;
    iVar1 = fl_filename_match(s,((Fl_File_Icon *)ppFVar2)->pattern_);
    if (iVar1 != 0) {
      return (Fl_File_Icon *)ppFVar2;
    }
  }
  return (Fl_File_Icon *)ppFVar2;
}

Assistant:

Fl_File_Icon *				// O - Matching file icon or NULL
Fl_File_Icon::find(const char *filename,// I - Name of file */
                   int        filetype)	// I - Enumerated file type
{
  Fl_File_Icon	*current;		// Current file in list
#ifndef WIN32
  struct stat	fileinfo;		// Information on file
#endif // !WIN32
  const char	*name;			// Base name of filename


  // Get file information if needed...
  if (filetype == ANY)
  {
#ifdef WIN32
    if (filename[strlen(filename) - 1] == '/')
      filetype = DIRECTORY;
    else if (fl_filename_isdir(filename))
      filetype = DIRECTORY;
    else
      filetype = PLAIN;
#else
    if (!fl_stat(filename, &fileinfo))
    {
      if (S_ISDIR(fileinfo.st_mode))
        filetype = DIRECTORY;
#  ifdef S_IFIFO
      else if (S_ISFIFO(fileinfo.st_mode))
        filetype = FIFO;
#  endif // S_IFIFO
#  if defined(S_ICHR) && defined(S_IBLK)
      else if (S_ISCHR(fileinfo.st_mode) || S_ISBLK(fileinfo.st_mode))
        filetype = DEVICE;
#  endif // S_ICHR && S_IBLK
#  ifdef S_ILNK
      else if (S_ISLNK(fileinfo.st_mode))
        filetype = LINK;
#  endif // S_ILNK
      else
        filetype = PLAIN;
    }
    else
      filetype = PLAIN;
#endif // WIN32
  }

  // Look at the base name in the filename
  name = fl_filename_name(filename);

  // Loop through the available file types and return any match that
  // is found...
  for (current = first_; current != (Fl_File_Icon *)0; current = current->next_)
    if ((current->type_ == filetype || current->type_ == ANY) &&
        (fl_filename_match(filename, current->pattern_) ||
	 fl_filename_match(name, current->pattern_)))
      break;

  // Return the match (if any)...
  return (current);
}